

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::TermList>_> *
__thiscall
Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::TermList>_>::
Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::next(Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
       *this)

{
  TypedTermList t;
  bool bVar1;
  SortId in_RSI;
  Renaming *in_RDI;
  Renaming normalizer;
  TermWithValue<Kernel::TermList> *ld;
  Renaming *in_stack_ffffffffffffff58;
  Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
  *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 uVar2;
  TermList TVar3;
  undefined1 local_78 [32];
  Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
  *in_stack_ffffffffffffffa8;
  Entry *local_18;
  
  TVar3._content = (uint64_t)in_RDI;
  do {
    bVar1 = hasLeafData(in_stack_ffffffffffffff60);
    uVar2 = false;
    if (!bVar1) {
      uVar2 = findNextLeaf(in_stack_ffffffffffffffa8);
    }
  } while ((bool)uVar2 != false);
  Lib::Option<Lib::VirtualIterator<Indexing::TermWithValue<Kernel::TermList>_*>_>::operator->
            ((Option<Lib::VirtualIterator<Indexing::TermWithValue<Kernel::TermList>_*>_> *)0x55f1f3)
  ;
  local_18 = (Entry *)Lib::VirtualIterator<Indexing::TermWithValue<Kernel::TermList>_*>::next
                                ((VirtualIterator<Indexing::TermWithValue<Kernel::TermList>_*> *)
                                 0x55f1fb);
  if ((*(byte *)(in_RSI._content + 0xe8) & 1) != 0) {
    in_stack_ffffffffffffff60 =
         (Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
          *)&stack0xffffffffffffffb8;
    Kernel::Renaming::Renaming((Renaming *)in_stack_ffffffffffffff60);
    TermWithValue<Kernel::TermList>::key((TermWithValue<Kernel::TermList> *)local_18);
    t._sort._content = in_RSI._content;
    t.super_TermList._content = TVar3._content;
    Kernel::Renaming::normalizeVariables(in_RDI,t);
    RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>::bdRecord
              (&in_stack_ffffffffffffff60->_algo,(BacktrackData *)in_stack_ffffffffffffff58);
    *(undefined1 *)(in_RSI._content + 0x148) = 1;
    RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>::denormalize
              (&in_stack_ffffffffffffff60->_algo,in_stack_ffffffffffffff58);
    Kernel::Renaming::~Renaming((Renaming *)0x55f28a);
  }
  RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>::unifier
            ((RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_> *)local_78);
  QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::TermList>_>
  ::QueryRes((QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::TermList>_>
              *)in_RDI,
             (SmartPtr<Indexing::ResultSubstitution> *)CONCAT17(uVar2,in_stack_ffffffffffffff68),
             (TermWithValue<Kernel::TermList> *)in_stack_ffffffffffffff60);
  Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr
            ((SmartPtr<Indexing::ResultSubstitution> *)in_stack_ffffffffffffff60);
  return (QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithValue<Kernel::TermList>_>
          *)(Renaming *)TVar3._content;
}

Assistant:

QueryRes<Unifier, LeafData> next()
      {
        while(!hasLeafData() && findNextLeaf()) {}
        ASS(hasLeafData());

        ASS(!_normalizationRecording);

        auto ld = _leafData->next();
        if (_retrieveSubstitution) {
            Renaming normalizer;
            normalizer.normalizeVariables(ld->key());

            ASS(_normalizationBacktrackData.isEmpty());
            _algo.bdRecord(_normalizationBacktrackData);
            _normalizationRecording=true;

            _algo.denormalize(normalizer);
        }

        DEBUG_QUERY(1, "leaf data: ", *ld)
        return QueryRes(_algo.unifier(), ld);
      }